

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O3

bool __thiscall
Assimp::DXFImporter::CanRead(DXFImporter *this,string *filename,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  char *pTokens [4];
  string local_68;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  char *pcStack_30;
  
  BaseImporter::GetExtension(&local_68,filename);
  iVar2 = std::__cxx11::string::compare((char *)&local_68);
  if (iVar2 == 0) {
    bVar1 = true;
  }
  else if (local_68._M_string_length == 0 || checkSig) {
    local_38 = "ENDSEC";
    pcStack_30 = "BLOCKS";
    local_48 = "SECTION";
    pcStack_40 = "HEADER";
    bVar1 = BaseImporter::SearchFileHeaderForToken(pIOHandler,filename,&local_48,4,0x20,false,false)
    ;
  }
  else {
    bVar1 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool DXFImporter::CanRead( const std::string& filename, IOSystem* pIOHandler, bool checkSig ) const {
    const std::string& extension = GetExtension( filename );
    if ( extension == desc.mFileExtensions ) {
        return true;
    }

    if ( extension.empty() || checkSig ) {
        const char *pTokens[] = { "SECTION", "HEADER", "ENDSEC", "BLOCKS" };
        return BaseImporter::SearchFileHeaderForToken(pIOHandler, filename, pTokens, 4, 32 );
    }

    return false;
}